

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O2

size_t CB_EXPLORE_ADF::fill_tied(cb_explore_adf *param_1,v_array<ACTION_SCORE::action_score> *preds)

{
  action_score *paVar1;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  paVar1 = preds->_begin;
  lVar3 = (long)preds->_end - (long)paVar1;
  if (lVar3 == 0) {
    sVar2 = 0;
  }
  else {
    uVar4 = lVar3 >> 3;
    sVar2 = uVar4 + (uVar4 == 0);
    for (uVar5 = 1; uVar5 < uVar4; uVar5 = uVar5 + 1) {
      if ((paVar1[uVar5].score != paVar1->score) || (NAN(paVar1[uVar5].score) || NAN(paVar1->score))
         ) {
        return uVar5;
      }
    }
  }
  return sVar2;
}

Assistant:

inline size_t size() const { return _end - _begin; }